

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_file.cpp
# Opt level: O0

request_ptr __thiscall
foxxll::linuxaio_file::awrite
          (linuxaio_file *this,void *buffer,offset_type offset,size_type bytes,
          completion_handler *on_complete)

{
  int iVar1;
  instance_pointer this_00;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> *in_R9;
  read_or_write local_54;
  linuxaio_file *local_50;
  tlx local_48 [15];
  undefined1 local_39;
  completion_handler *on_complete_local;
  size_type bytes_local;
  offset_type offset_local;
  void *buffer_local;
  linuxaio_file *this_local;
  request_ptr *req;
  
  local_39 = 0;
  local_54 = WRITE;
  local_50 = (linuxaio_file *)buffer;
  on_complete_local = on_complete;
  bytes_local = bytes;
  offset_local = offset;
  buffer_local = buffer;
  this_local = this;
  tlx::
  make_counting<foxxll::linuxaio_request,tlx::Delegate<void(foxxll::request*,bool),std::allocator<void>>const&,foxxll::linuxaio_file*,void*&,unsigned_long&,unsigned_long&,foxxll::request_interface::read_or_write>
            (local_48,in_R9,&local_50,(void **)&offset_local,&bytes_local,
             (unsigned_long *)&on_complete_local,&local_54);
  tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>::
  CountingPtr<foxxll::linuxaio_request,void>
            ((CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter> *)this,
             (CountingPtr<foxxll::linuxaio_request,_tlx::CountingPtrDefaultDeleter> *)local_48);
  tlx::CountingPtr<foxxll::linuxaio_request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
            ((CountingPtr<foxxll::linuxaio_request,_tlx::CountingPtrDefaultDeleter> *)local_48);
  this_00 = singleton<foxxll::disk_queues,_true>::get_instance();
  iVar1 = disk_queued_file::get_queue_id((disk_queued_file *)((long)buffer + 0x60));
  disk_queues::add_request(this_00,(request_ptr *)this,(long)iVar1);
  return (request_ptr)(request *)this;
}

Assistant:

request_ptr linuxaio_file::awrite(
    void* buffer, offset_type offset, size_type bytes,
    const completion_handler& on_complete)
{
    request_ptr req = tlx::make_counting<linuxaio_request>(
            on_complete, this, buffer, offset, bytes, request::WRITE
        );

    disk_queues::get_instance()->add_request(req, get_queue_id());

    return req;
}